

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  
  test_scalar();
  test_all();
  test_errors();
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    test_scalar();
    test_all();
    test_errors();
    return 0;
}